

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall tinyusdz::ascii::AsciiParser::ParseMatrix(AsciiParser *this,matrix2f *result)

{
  bool bVar1;
  size_t i;
  long lVar2;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> content;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = Expect(this,'(');
  if (!bVar1) {
    return false;
  }
  content.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  content.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  content.super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = SepBy1TupleType<float,2ul>(this,',',&content);
  if (bVar1) {
    if ((long)content.
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)content.
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0x10) {
      bVar1 = Expect(this,')');
      if (bVar1) {
        for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
          result->m[lVar2][0] =
               content.
               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar2]._M_elems[0];
          result->m[lVar2][1] =
               content.
               super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar2]._M_elems[1];
        }
        bVar1 = true;
        goto LAB_002b8821;
      }
    }
    else {
      std::__cxx11::to_string
                (&local_80,
                 (long)content.
                       super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)content.
                       super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
      ::std::operator+(&local_60,"# of rows in matrix2f must be 2, but got ",&local_80);
      ::std::operator+(&local_40,&local_60,"\n");
      PushError(this,(string *)&local_40);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
  }
  bVar1 = false;
LAB_002b8821:
  ::std::_Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
  ~_Vector_base(&content.
                 super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
               );
  return bVar1;
}

Assistant:

bool AsciiParser::ParseMatrix(value::matrix2f *result) {

  if (!Expect('(')) {
    return false;
  }

  std::vector<std::array<float, 2>> content;
  if (!SepBy1TupleType<float, 2>(',', &content)) {
    return false;
  }

  if (content.size() != 2) {
    PushError("# of rows in matrix2f must be 2, but got " +
              std::to_string(content.size()) + "\n");
    return false;
  }

  if (!Expect(')')) {
    return false;
  }

  for (size_t i = 0; i < 2; i++) {
    result->m[i][0] = content[i][0];
    result->m[i][1] = content[i][1];
  }

  return true;
}